

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

int __thiscall
tetgenmesh::scoutcrossedge
          (tetgenmesh *this,triface *crosstet,arraypool *missingshbds,arraypool *missingshs)

{
  tetrahedron *pppdVar1;
  char *pcVar2;
  shellface *pppdVar3;
  shellface ppdVar4;
  shellface pb;
  shellface pc;
  memorypool *pmVar5;
  long lVar6;
  tetrahedron P;
  point A;
  point B;
  point C;
  bool bVar7;
  undefined8 uVar8;
  uint uVar9;
  interresult iVar10;
  int iVar11;
  long lVar13;
  long lVar14;
  tetrahedron ppdVar15;
  ulong uVar16;
  int iVar17;
  tetrahedron *pppdVar18;
  long *plVar19;
  face *sface;
  long lVar20;
  ulong uVar21;
  undefined8 *puVar22;
  long lVar23;
  double dVar24;
  int types [2];
  int poss [4];
  triface local_58;
  tetrahedron *local_48;
  face local_40;
  ulong uVar12;
  
  lVar14 = 0;
  bVar7 = false;
  while ((lVar13 = missingshbds->objects, lVar14 < lVar13 && (!bVar7))) {
    pcVar2 = missingshbds->toparray
             [(uint)lVar14 >> ((byte)missingshbds->log2objectsperblock & 0x1f)];
    lVar13 = (long)missingshbds->objectbytes *
             (long)(int)(missingshbds->objectsperblockmark & (uint)lVar14);
    uVar21 = *(ulong *)((*(ulong *)(*(long *)(pcVar2 + lVar13) + 0x30 +
                                   (long)(*(int *)(pcVar2 + lVar13 + 8) >> 1) * 8) &
                        0xfffffffffffffff8) + 0x48);
    uVar9 = (uint)uVar21 & 0xf;
    uVar12 = (ulong)uVar9;
    uVar21 = uVar21 & 0xfffffffffffffff0;
    uVar16 = uVar21;
    if (*(long *)(uVar21 + (long)orgpivot[uVar9] * 8) !=
        *(long *)(*(long *)(pcVar2 + lVar13) + (long)sorgpivot[*(int *)(pcVar2 + lVar13 + 8)] * 8))
    {
      uVar12 = (ulong)(uint)esymtbl[uVar12];
    }
    do {
      iVar11 = (int)uVar12;
      if ((*(byte *)(*(long *)(uVar16 + (long)apexpivot[iVar11] * 8) + 4 +
                    (long)this->pointmarkindex * 4) & 2) != 0) {
        pppdVar3 = *(shellface **)(pcVar2 + lVar13);
        for (iVar17 = 0; iVar17 != 2; iVar17 = iVar17 + 1) {
          uVar9 = enexttbl[(int)uVar12];
          uVar12 = (ulong)uVar9;
          if (*(long *)(uVar16 + 0x40) == 0) {
LAB_001279d0:
            local_40.shver = snextpivot[*(int *)(pcVar2 + lVar13 + 8)];
LAB_001279d3:
            local_48 = (tetrahedron *)CONCAT44(local_48._4_4_,local_40.shver);
            ppdVar4 = pppdVar3[sorgpivot[local_40.shver]];
            pb = pppdVar3[sdestpivot[local_40.shver]];
            pc = pppdVar3[sapexpivot[local_40.shver]];
            local_40.sh = pppdVar3;
            calculateabovepoint4
                      (this,(point)ppdVar4,(point)pb,(point)pc,
                       *(point *)(uVar16 + (long)destpivot[(int)uVar9] * 8));
            dVar24 = orient3d((double *)ppdVar4,(double *)pb,(double *)pc,this->dummypoint);
            if (dVar24 <= 0.0) {
              if ((dVar24 == 0.0) && (!NAN(dVar24))) {
                terminatetetgen(this,2);
              }
            }
            else {
              local_40.shver = snextpivot[(int)((uint)local_48 ^ 1)];
            }
            iVar10 = sscoutsegment(this,&local_40,
                                   *(point *)(uVar16 + (long)destpivot[(int)uVar9] * 8),0,0,1);
            if (iVar10 == SHAREEDGE) {
              poss[0] = 0;
              poss[1] = 0;
              poss[2] = 0;
              makeshellface(this,this->subsegs,(face *)poss);
              iVar11 = poss[2];
              uVar8 = poss._0_8_;
              local_40.sh[(long)(local_40.shver >> 1) + 6] = (shellface)((long)poss[2] | poss._0_8_)
              ;
              *(ulong *)poss._0_8_ = (long)local_40.shver | (ulong)local_40.sh;
              ppdVar4 = local_40.sh[local_40.shver >> 1];
              *(shellface *)
               (((ulong)ppdVar4 & 0xfffffffffffffff8) + 0x30 + (ulong)((uint)ppdVar4 & 6) * 4) =
                   (shellface)((long)poss[2] | poss._0_8_);
              *(shellface *)poss._0_8_ = ppdVar4;
              lawsonflip(this);
              uVar21 = *(ulong *)(uVar8 + (long)(iVar11 >> 1) * 8);
              uVar16 = uVar21 & 0xfffffffffffffff8;
              uVar21 = (ulong)((uint)uVar21 & 6);
              *(undefined8 *)(uVar16 + 0x30 + uVar21 * 4) = 0;
              uVar21 = *(ulong *)(uVar16 + uVar21 * 4);
              uVar9 = (uint)uVar21;
              local_40.shver = uVar9 & 7;
              local_40.sh = (shellface *)(uVar21 & 0xfffffffffffffff8);
              *(undefined8 *)((long)local_40.sh + (ulong)(uVar9 & 6) * 4 + 0x30) = 0;
              pmVar5 = this->subsegs;
              *(undefined8 *)(uVar8 + 0x18) = 0;
              *(void **)uVar8 = pmVar5->deaditemstack;
              pmVar5->deaditemstack = (void *)uVar8;
              pmVar5->items = pmVar5->items + -1;
              bVar7 = true;
              goto LAB_00127c07;
            }
            if (this->flipstack != (badface *)0x0) {
              lawsonflip(this);
            }
            break;
          }
          if (*(long *)(*(long *)(uVar16 + 0x40) + (long)ver2edge[(int)uVar9] * 8) == 0) {
            if (iVar17 == 0) goto LAB_001279d0;
            local_40.shver = snextpivot[snextpivot[*(int *)(pcVar2 + lVar13 + 8)]] ^ 1;
            uVar9 = esymtbl[(int)uVar9];
            goto LAB_001279d3;
          }
        }
      }
      uVar12 = *(ulong *)(uVar16 + (long)facepivot1[iVar11] * 8);
      uVar16 = uVar12 & 0xfffffffffffffff0;
      uVar12 = (ulong)(uint)facepivot2[iVar11][(uint)uVar12 & 0xf];
    } while (uVar16 != uVar21);
    bVar7 = false;
LAB_00127c07:
    lVar14 = lVar14 + 1;
  }
  if (bVar7) {
    lVar13 = 0;
    lVar14 = missingshs->objects;
    if (missingshs->objects < 1) {
      lVar14 = lVar13;
    }
    for (; lVar13 != lVar14; lVar13 = lVar13 + 1) {
      plVar19 = (long *)((long)(missingshs->toparray
                                [(uint)lVar13 >> ((byte)missingshs->log2objectsperblock & 0x1f)] +
                               (long)missingshs->objectbytes *
                               (long)(int)(missingshs->objectsperblockmark & (uint)lVar13)) + 8);
      lVar6 = *(long *)(missingshs->toparray
                        [(uint)lVar13 >> ((byte)missingshs->log2objectsperblock & 0x1f)] +
                       (long)missingshs->objectbytes *
                       (long)(int)(missingshs->objectsperblockmark & (uint)lVar13));
      iVar11 = this->shmarkindex;
      for (iVar17 = 0; iVar17 != 3; iVar17 = iVar17 + 1) {
        lVar23 = *plVar19;
        lVar20 = (long)((int)lVar23 >> 1);
        uVar21 = *(ulong *)(lVar6 + 0x30 + lVar20 * 8);
        if ((uVar21 != 0) &&
           (puVar22 = (undefined8 *)(uVar21 & 0xfffffffffffffff8),
           (*(byte *)((long)puVar22 + (long)iVar11 * 4 + 4) & 1) != 0)) {
          uVar9 = (uint)puVar22[9] & 0xf;
          uVar16 = puVar22[9] & 0xfffffffffffffff0;
          uVar21 = uVar16;
          do {
            if (*(long *)(uVar21 + 0x40) != 0) {
              *(undefined8 *)(*(long *)(uVar21 + 0x40) + (long)ver2edge[(int)uVar9] * 8) = 0;
            }
            uVar12 = *(ulong *)(uVar21 + (long)facepivot1[(int)uVar9] * 8);
            uVar21 = uVar12 & 0xfffffffffffffff0;
            uVar9 = facepivot2[(int)uVar9][(uint)uVar12 & 0xf];
          } while (uVar21 != uVar16);
          pmVar5 = this->subsegs;
          puVar22[3] = 0;
          *puVar22 = pmVar5->deaditemstack;
          pmVar5->deaditemstack = puVar22;
          pmVar5->items = pmVar5->items + -1;
          *(undefined8 *)(lVar6 + 0x30 + lVar20 * 8) = 0;
        }
        plVar19 = (long *)(snextpivot + (int)lVar23);
      }
    }
    this->fillregioncount = this->fillregioncount + 1;
    return 0;
  }
  lVar14 = 0;
  iVar11 = 0;
LAB_00127d5b:
  if (lVar13 <= lVar14) {
    return iVar11;
  }
  if (iVar11 != 0) {
    return iVar11;
  }
  lVar13 = (long)missingshbds->objectbytes *
           (long)(int)(missingshbds->objectsperblockmark & (uint)lVar14);
  uVar21 = *(ulong *)((*(ulong *)(*(long *)(missingshbds->toparray
                                            [(uint)lVar14 >>
                                             ((byte)missingshbds->log2objectsperblock & 0x1f)] +
                                           lVar13) + 0x30 +
                                 (long)(*(int *)(missingshbds->toparray
                                                 [(uint)lVar14 >>
                                                  ((byte)missingshbds->log2objectsperblock & 0x1f)]
                                                + lVar13 + 8) >> 1) * 8) & 0xfffffffffffffff8) +
                     0x48);
  uVar9 = (uint)uVar21 & 0xf;
  pppdVar18 = (tetrahedron *)(uVar21 & 0xfffffffffffffff0);
  local_48 = pppdVar18;
  do {
    P = pppdVar18[apexpivot[(int)uVar9]];
    if ((((P != (tetrahedron)this->dummypoint) &&
         (ppdVar15 = pppdVar18[oppopivot[(int)uVar9]], ppdVar15 != (tetrahedron)this->dummypoint))
        && ((*(byte *)((long)P + (long)this->pointmarkindex * 4 + 4) & 2) == 0)) &&
       ((*(byte *)((long)ppdVar15 + (long)this->pointmarkindex * 4 + 4) & 2) == 0)) {
      for (lVar13 = 0; lVar13 < missingshs->objects; lVar13 = lVar13 + 1) {
        pcVar2 = missingshs->toparray
                 [(uint)lVar13 >> ((byte)missingshs->log2objectsperblock & 0x1f)];
        lVar23 = (long)missingshs->objectbytes *
                 (long)(int)(missingshs->objectsperblockmark & (uint)lVar13);
        lVar6 = *(long *)(pcVar2 + lVar23);
        iVar11 = *(int *)(pcVar2 + lVar23 + 8);
        A = *(point *)(lVar6 + (long)sorgpivot[iVar11] * 8);
        B = *(point *)(lVar6 + (long)sdestpivot[iVar11] * 8);
        C = *(point *)(lVar6 + (long)sapexpivot[iVar11] * 8);
        iVar11 = tri_edge_test(this,A,B,C,(point)P,(point)ppdVar15,(point)0x0,1,types,poss);
        if (iVar11 != 0) {
          if (iVar11 != 2) goto LAB_00127ffe;
          sface = (face *)(pcVar2 + lVar23);
          if ((types[0] & 0xfffffffeU) != 8) {
            report_selfint_face(this,A,B,C,sface,crosstet,2,types,poss);
            goto LAB_00127ffe;
          }
          crosstet->tet = pppdVar18;
          iVar11 = edestoppotbl[(int)uVar9];
          crosstet->ver = iVar11;
          if ((pppdVar18[8] != (tetrahedron)0x0) &&
             (pppdVar18[8][ver2edge[iVar11]] != (double *)0x0)) {
            report_selfint_face(this,A,B,C,sface,crosstet,2,types,poss);
            goto LAB_001280db;
          }
          local_58.tet = crosstet->tet;
          local_58.ver = crosstet->ver;
          local_58._12_4_ = *(undefined4 *)&crosstet->field_0xc;
          goto LAB_0012804c;
        }
      }
    }
    pppdVar1 = pppdVar18 + facepivot1[(int)uVar9];
    pppdVar18 = (tetrahedron *)((ulong)*pppdVar1 & 0xfffffffffffffff0);
    uVar9 = facepivot2[(int)uVar9][(uint)*pppdVar1 & 0xf];
  } while (pppdVar18 != local_48);
LAB_00127ffe:
  iVar11 = 0;
  goto LAB_00128007;
  while( true ) {
    pppdVar1 = local_58.tet + (local_58.ver & 3U);
    local_58.tet = (tetrahedron *)((ulong)*pppdVar1 & 0xfffffffffffffff0);
    local_58.ver = fsymtbl[local_58.ver][(uint)*pppdVar1 & 0xf];
    if (pppdVar18 == local_58.tet) break;
LAB_0012804c:
    ppdVar15 = local_58.tet[9];
    if ((ppdVar15 != (tetrahedron)0x0) && (ppdVar15[local_58.ver & 3U] != (double *)0x0))
    goto LAB_0012809c;
  }
  ppdVar15 = local_58.tet[9];
  if (ppdVar15 != (tetrahedron)0x0) {
LAB_0012809c:
    if (ppdVar15[local_58.ver & 3] != (double *)0x0) {
      report_selfint_face(this,A,B,C,sface,&local_58,2,types,poss);
    }
  }
LAB_001280db:
  dVar24 = orient3d(A,B,C,(double *)P);
  iVar11 = 1;
  if (dVar24 < 0.0) {
    crosstet->ver = esymtbl[crosstet->ver];
    iVar11 = 1;
  }
LAB_00128007:
  lVar14 = lVar14 + 1;
  lVar13 = missingshbds->objects;
  goto LAB_00127d5b;
}

Assistant:

int tetgenmesh::scoutcrossedge(triface& crosstet, arraypool* missingshbds, 
                               arraypool* missingshs)
{
  triface searchtet, spintet, neightet;
  face oldsh, searchsh, *parysh;
  face neighseg;
  point pa, pb, pc, pd, pe;
  REAL ori;
  int types[2], poss[4];
  int searchflag, interflag;
  int t1ver;
  int i, j;

  searchflag = 0;

  // Search the first new subface to fill the region.
  for (i = 0; i < missingshbds->objects && !searchflag; i++) {
    parysh = (face *) fastlookup(missingshbds, i);
    sspivot(*parysh, neighseg);
    sstpivot1(neighseg, searchtet);
    if (org(searchtet) != sorg(*parysh)) {
      esymself(searchtet);
    }
    spintet = searchtet;
    while (1) {
      if (pmarktested(apex(spintet))) {
        // A possible interior face.
        neightet = spintet;
        oldsh = *parysh;
		// Try to recover an interior edge.
		for (j = 0; j < 2; j++) {
		  enextself(neightet);
          if (!issubseg(neightet)) {
			if (j == 0) {
              senext(oldsh, searchsh);
            } else {
              senext2(oldsh, searchsh);
              sesymself(searchsh);
		      esymself(neightet);
            }
            // Calculate a lifted point. 
			pa = sorg(searchsh);
            pb = sdest(searchsh);
            pc = sapex(searchsh);
            pd = dest(neightet);
            calculateabovepoint4(pa, pb, pc, pd);
            // The lifted point must lie above 'searchsh'.
			ori = orient3d(pa, pb, pc, dummypoint);
			if (ori > 0) {
		      sesymself(searchsh);
		      senextself(searchsh);
		    } else if (ori == 0) {
		      terminatetetgen(this, 2);
		    }
			if (sscoutsegment(&searchsh,dest(neightet),0,0,1)==SHAREEDGE) {
              // Insert a temp segment to protect the recovered edge.
              face tmpseg;
              makeshellface(subsegs, &tmpseg);
              ssbond(searchsh, tmpseg);
              spivotself(searchsh);
              ssbond(searchsh, tmpseg);
              // Recover locally Delaunay edges.
              lawsonflip();
              // Delete the tmp segment.
              spivot(tmpseg, searchsh);
              ssdissolve(searchsh);
              spivotself(searchsh);
              ssdissolve(searchsh);
              shellfacedealloc(subsegs, tmpseg.sh);
			  searchflag = 1;
            } else {
              // Undo the performed flips.
              if (flipstack != NULL) {
                lawsonflip();
              }
            }
            break;
          } // if (!issubseg(neightet))
		} // j
        if (searchflag) break;
      } // if (pmarktested(apex(spintet)))
      fnextself(spintet);
      if (spintet.tet == searchtet.tet) break;
    }
  } // i

  if (searchflag) {
	// Remove faked segments.
    face checkseg;
    // Remark: We should not use the array 'missingshbds', since the flips may
    //   change the subfaces. We search them from the subfaces in R.
    for (i = 0; i < missingshs->objects; i++) {
      parysh = (face *) fastlookup(missingshs, i);
      oldsh = *parysh;
      for (j = 0; j < 3; j++) {
        if (isshsubseg(oldsh)) {
          sspivot(oldsh, checkseg);
          if (sinfected(checkseg)) {
            // It's a faked segment. Delete it.
            sstpivot1(checkseg, searchtet);
            spintet = searchtet;
            while (1) {
              tssdissolve1(spintet);
              fnextself(spintet);
              if (spintet.tet == searchtet.tet) break;
            }
            shellfacedealloc(subsegs, checkseg.sh);
            ssdissolve(oldsh);
          }
        }
        senextself(oldsh);
      } // j
    }

    fillregioncount++;

    return 0;
  } // if (i < missingshbds->objects)

  searchflag = 0;

  for (j = 0; j < missingshbds->objects && !searchflag; j++) {
    parysh = (face *) fastlookup(missingshbds, j);
    sspivot(*parysh, neighseg);
    sstpivot1(neighseg, searchtet);
    interflag = 0;
    // Let 'spintet' be [#,#,d,e] where [#,#] is the boundary edge of R.
    spintet = searchtet;
    while (1) {
      pd = apex(spintet);
      pe = oppo(spintet);
      // Skip a hull edge.
      if ((pd != dummypoint) && (pe != dummypoint)) {
        // Skip an edge containing a vertex of R.
        if (!pmarktested(pd) && !pmarktested(pe)) {
          // Check if [d,e] intersects R.
          for (i = 0; i < missingshs->objects && !interflag; i++) {
            parysh = (face *) fastlookup(missingshs, i);
            pa = sorg(*parysh);
            pb = sdest(*parysh);
            pc = sapex(*parysh);
            interflag=tri_edge_test(pa, pb, pc, pd, pe, NULL, 1, types, poss);
            if (interflag > 0) { 
              if (interflag == 2) {
                // They intersect at a single point.
				if ((types[0] == (int) ACROSSFACE) ||
				    (types[0] == (int) ACROSSEDGE)) {
                  // Go to the crossing edge [d,e,#,#].
                  edestoppo(spintet, crosstet); // // [d,e,#,#].
                  if (issubseg(crosstet)) {
				    // It is a segment. Report a PLC problem.
				    report_selfint_face(pa, pb, pc, parysh, &crosstet, 
					                    interflag, types, poss);
                  } else {
				    triface chkface = crosstet;
					while (1) {
					  if (issubface(chkface)) break;
					  fsymself(chkface);
					  if (chkface.tet == crosstet.tet) break;
					}
					if (issubface(chkface)) {
					  // Two subfaces are intersecting.
                      report_selfint_face(pa, pb, pc, parysh, &chkface, 
					                    interflag, types, poss);
					}
				  }
                  // Adjust the edge such that d lies below [a,b,c].
                  ori = orient3d(pa, pb, pc, pd);
                  if (ori < 0) {
                    esymself(crosstet);
                  }
                  searchflag = 1;                  
                } else {
                  // An improper intersection type, ACROSSVERT, TOUCHFACE,
				  //   TOUCHEDGE, SHAREVERT, ...
                  // Maybe it is due to a PLC problem.
				  report_selfint_face(pa, pb, pc, parysh, &crosstet, 
					                  interflag, types, poss);
                }
              }
              break;
            } // if (interflag > 0)
          }
        } 
      }
      // Leave search at this bdry edge if an intersection is found.
      if (interflag > 0) break;
      // Go to the next tetrahedron.
      fnextself(spintet);
      if (spintet.tet == searchtet.tet) break; 
    } // while (1)
  } // j

  return searchflag;
}